

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCommon.h
# Opt level: O2

void __thiscall
ASTFinder<luna::Terminator,_FindName>::~ASTFinder(ASTFinder<luna::Terminator,_FindName> *this)

{
  (this->super_Visitor)._vptr_Visitor = (_func_int **)&PTR__ASTFinder_00197c88;
  std::__cxx11::string::~string((string *)&this->finder_);
  return;
}

Assistant:

explicit ASTFinder(const FinderType &finder)
        : the_ast_node_(nullptr), finder_(finder) { }